

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError BuildDeviceList(PaAlsaHostApiRepresentation *alsaApi,void **scanResults,int *count)

{
  PaUtilAllocationGroup *pPVar1;
  PaDeviceInfo **deviceInfos;
  PaAlsaHostApiRepresentation *alsaApi_00;
  HwDevInfo *devInfo_00;
  PaAlsaDeviceInfo *deviceHwInfo;
  size_t sVar2;
  snd_ctl_t *psVar3;
  uint uVar4;
  snd_pcm_info_t *psVar5;
  void **ppvVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  snd_ctl_card_info_t *psVar11;
  snd_pcm_info_t *__s;
  pthread_t pVar12;
  snd_config_iterator_t p_Var13;
  snd_config_iterator_t p_Var14;
  snd_config_t *psVar15;
  char *pcVar16;
  HwDevInfo *pHVar17;
  void *pvVar18;
  ulong uVar19;
  long lVar20;
  undefined8 uStack_260;
  snd_ctl_card_info_t asStack_258 [8];
  PaUtilAllocationGroup *local_250;
  PaUtilAllocationGroup *local_248;
  long local_240;
  long local_238;
  long local_230;
  snd_config_iterator_t local_228;
  long local_220;
  bool local_211;
  PaAlsaHostApiRepresentation *local_210;
  bool local_201;
  snd_config_t *local_200;
  HwDevInfo *hwInfo_2;
  HwDevInfo *hwInfo_1;
  PaAlsaDeviceInfo *devInfo_1;
  HwDevInfo *hwInfo;
  PaAlsaDeviceInfo *devInfo;
  int local_1d0;
  int __pa_unsure_error_id_3;
  int __pa_unsure_error_id_2;
  int __pa_unsure_error_id_1;
  snd_config_t *tp;
  snd_config_t *n;
  HwDevInfo *predefined;
  char *deviceName_1;
  char *alsaDeviceName_1;
  char *pcStack_198;
  int err;
  char *idStr;
  char *tpStr;
  snd_config_iterator_t next;
  snd_config_iterator_t i_1;
  int local_170;
  int __pa_unsure_error_id;
  int hasCapture;
  int hasPlayback;
  size_t len;
  char *infoName;
  char *deviceName;
  char *alsaDeviceName;
  char buf [67];
  snd_ctl_t *local_f8;
  snd_ctl_t *ctl;
  char *pcStack_e8;
  int devIdx_1;
  char *cardName;
  size_t __alsa_alloca_size_1;
  size_t __alsa_alloca_size;
  PaLinuxScanDeviceInfosResults *out;
  char alsaCardName [50];
  char *hwPrefix;
  int local_80;
  int usePlughw;
  int blocking;
  int res;
  snd_pcm_info_t *pcmInfo;
  snd_config_t *topNode;
  HwDevInfo *hwDevInfos;
  size_t i;
  size_t maxDeviceNames;
  size_t numDeviceNames;
  snd_ctl_card_info_t *psStack_40;
  PaError result;
  snd_ctl_card_info_t *cardInfo;
  int devIdx;
  int cardIdx;
  PaAlsaDeviceInfo *deviceInfoArray;
  PaUtilHostApiRepresentation *baseApi;
  int *count_local;
  void **scanResults_local;
  PaAlsaHostApiRepresentation *alsaApi_local;
  
  cardInfo._4_4_ = 0xffffffff;
  cardInfo._0_4_ = 0;
  numDeviceNames._4_4_ = 0;
  maxDeviceNames = 0;
  i = 1;
  topNode = (snd_config_t *)0x0;
  pcmInfo = (snd_pcm_info_t *)0x0;
  local_80 = 1;
  hwPrefix._4_4_ = 0;
  stack0xffffffffffffff70 = "";
  __alsa_alloca_size = 0;
  uStack_260 = 0x11cfe7;
  deviceInfoArray = (PaAlsaDeviceInfo *)alsaApi;
  baseApi = (PaUtilHostApiRepresentation *)count;
  count_local = (int *)scanResults;
  scanResults_local = (void **)alsaApi;
  pcVar9 = getenv("PA_ALSA_INITIALIZE_BLOCK");
  if (pcVar9 != (char *)0x0) {
    uStack_260 = 0x11cff9;
    pcVar9 = getenv("PA_ALSA_INITIALIZE_BLOCK");
    uStack_260 = 0x11d001;
    iVar7 = atoi(pcVar9);
    if (iVar7 != 0) {
      local_80 = 0;
    }
  }
  uStack_260 = 0x11d019;
  pcVar9 = getenv("PA_ALSA_PLUGHW");
  if (pcVar9 != (char *)0x0) {
    uStack_260 = 0x11d02b;
    pcVar9 = getenv("PA_ALSA_PLUGHW");
    uStack_260 = 0x11d033;
    iVar7 = atoi(pcVar9);
    if (iVar7 != 0) {
      hwPrefix._4_4_ = 1;
      stack0xffffffffffffff70 = "plug";
    }
  }
  cardInfo._4_4_ = 0xffffffff;
  uStack_260 = 0x11d05d;
  sVar10 = (*(code *)alsa_snd_ctl_card_info_sizeof)();
  lVar20 = -(sVar10 + 0xf & 0xfffffffffffffff0);
  psVar11 = asStack_258 + lVar20;
  __alsa_alloca_size_1 = sVar10;
  psStack_40 = psVar11;
  *(undefined8 *)(asStack_258 + lVar20 + -8) = 0x11d092;
  memset(psVar11,0,sVar10);
  *(undefined8 *)(asStack_258 + lVar20 + -8) = 0x11d09d;
  pcVar9 = (char *)(*(code *)alsa_snd_pcm_info_sizeof)();
  __s = (snd_pcm_info_t *)(psVar11 + -((ulong)(pcVar9 + 0xf) & 0xfffffffffffffff0));
  cardName = pcVar9;
  *(undefined8 *)(__s + -8) = 0x11d0d2;
  memset(__s,0,(size_t)pcVar9);
  while( true ) {
    *(undefined8 *)(__s + -8) = 0x11d0de;
    iVar7 = (*alsa_snd_card_next)((int *)((long)&cardInfo + 4));
    local_201 = iVar7 == 0 && -1 < (int)cardInfo._4_4_;
    if (iVar7 != 0 || -1 >= (int)cardInfo._4_4_) break;
    ctl._4_4_ = 0xffffffff;
    uVar19 = (ulong)cardInfo._4_4_;
    *(undefined8 *)(__s + -8) = 0x11d130;
    snprintf((char *)&out,0x32,"hw:%d",uVar19);
    *(undefined8 *)(__s + -8) = 0x11d149;
    iVar7 = (*alsa_snd_ctl_open)(&local_f8,(char *)&out,0);
    psVar11 = psStack_40;
    psVar3 = local_f8;
    if (-1 < iVar7) {
      *(undefined8 *)(__s + -8) = 0x11d164;
      (*alsa_snd_ctl_card_info)(psVar3,psVar11);
      psVar11 = psStack_40;
      local_210 = (PaAlsaHostApiRepresentation *)scanResults_local;
      *(undefined8 *)(__s + -8) = 0x11d17c;
      pcVar9 = (*alsa_snd_ctl_card_info_get_name)(psVar11);
      alsaApi_00 = local_210;
      *(undefined8 *)(__s + -8) = 0x11d192;
      paUtilErr_ = PaAlsa_StrDup(alsaApi_00,&stack0xffffffffffffff18,pcVar9);
      if (paUtilErr_ < 0) {
        *(undefined8 *)(__s + -8) = 0x11d1b9;
        PaUtil_DebugPrint(
                         "Expression \'PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo ))\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1329\n"
                         );
        numDeviceNames._4_4_ = paUtilErr_;
        goto LAB_0011df1f;
      }
      while( true ) {
        psVar3 = local_f8;
        *(undefined8 *)(__s + -8) = 0x11d1e2;
        iVar7 = (*alsa_snd_ctl_pcm_next_device)(psVar3,(int *)((long)&ctl + 4));
        pcVar9 = stack0xffffffffffffff70;
        psVar3 = local_f8;
        local_211 = iVar7 == 0 && -1 < (int)ctl._4_4_;
        if (iVar7 != 0 || -1 >= (int)ctl._4_4_) break;
        __pa_unsure_error_id = 0;
        local_170 = 0;
        uVar19 = (ulong)ctl._4_4_;
        *(undefined8 *)(__s + -8) = 0x11d253;
        snprintf((char *)&alsaDeviceName,0x43,"%s%s,%d",pcVar9,&out,uVar19);
        uVar4 = ctl._4_4_;
        *(undefined8 *)(__s + -8) = 0x11d266;
        (*(code *)alsa_snd_pcm_info_set_device)(__s,uVar4);
        *(undefined8 *)(__s + -8) = 0x11d275;
        (*(code *)alsa_snd_pcm_info_set_subdevice)(__s,0);
        *(undefined8 *)(__s + -8) = 0x11d287;
        (*alsa_snd_pcm_info_set_stream)(__s,SND_PCM_STREAM_CAPTURE);
        psVar3 = local_f8;
        *(undefined8 *)(__s + -8) = 0x11d29b;
        iVar7 = (*alsa_snd_ctl_pcm_info)(psVar3,__s);
        if (-1 < iVar7) {
          local_170 = 1;
        }
        *(undefined8 *)(__s + -8) = 0x11d2b9;
        (*alsa_snd_pcm_info_set_stream)(__s,SND_PCM_STREAM_PLAYBACK);
        psVar3 = local_f8;
        *(undefined8 *)(__s + -8) = 0x11d2cd;
        iVar7 = (*alsa_snd_ctl_pcm_info)(psVar3,__s);
        if (-1 < iVar7) {
          __pa_unsure_error_id = 1;
        }
        if ((__pa_unsure_error_id != 0) || (local_170 != 0)) {
          *(undefined8 *)(__s + -8) = 0x11d300;
          pcVar16 = (*alsa_snd_pcm_info_get_name)(__s);
          pcVar9 = pcStack_e8;
          *(undefined8 *)(__s + -8) = 0x11d30f;
          pcVar16 = SkipCardDetailsInName(pcVar16,pcVar9);
          pcVar9 = pcStack_e8;
          len = (size_t)pcVar16;
          *(undefined8 *)(__s + -8) = 0x11d340;
          iVar7 = snprintf((char *)0x0,0,"%s: %s (%s)",pcVar9,pcVar16,&alsaDeviceName);
          pPVar1 = (PaUtilAllocationGroup *)scanResults_local[0x24];
          _hasCapture = (long)(iVar7 + 1);
          *(undefined8 *)(__s + -8) = 0x11d363;
          pcVar16 = (char *)PaUtil_GroupAllocateMemory(pPVar1,(long)(iVar7 + 1));
          pcVar9 = pcStack_e8;
          sVar2 = len;
          sVar10 = _hasCapture;
          infoName = pcVar16;
          if (pcVar16 == (char *)0x0) {
            *(undefined8 *)(__s + -8) = 0x11d38c;
            PaUtil_DebugPrint(
                             "Expression \'deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1365\n"
                             );
            numDeviceNames._4_4_ = -0x2708;
            goto LAB_0011df1f;
          }
          *(undefined8 *)(__s + -8) = 0x11d3cb;
          snprintf(pcVar16,sVar10,"%s: %s (%s)",pcVar9,sVar2,&alsaDeviceName);
          psVar15 = topNode;
          maxDeviceNames = maxDeviceNames + 1;
          if ((topNode == (snd_config_t *)0x0) || (i < maxDeviceNames)) {
            sVar10 = i << 6;
            i = i << 1;
            *(undefined8 *)(__s + -8) = 0x11d404;
            topNode = (snd_config_t *)realloc(psVar15,sVar10);
            if (topNode == (snd_config_t *)0x0) {
              *(undefined8 *)(__s + -8) = 0x11d42a;
              PaUtil_DebugPrint(
                               "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1375\n"
                               );
              numDeviceNames._4_4_ = -0x2708;
              goto LAB_0011df1f;
            }
          }
          ppvVar6 = scanResults_local;
          *(undefined8 *)(__s + -8) = 0x11d453;
          paUtilErr_ = PaAlsa_StrDup((PaAlsaHostApiRepresentation *)ppvVar6,&deviceName,
                                     (char *)&alsaDeviceName);
          if (paUtilErr_ < 0) {
            *(undefined8 *)(__s + -8) = 0x11d47a;
            PaUtil_DebugPrint(
                             "Expression \'PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1378\n"
                             );
            numDeviceNames._4_4_ = paUtilErr_;
            goto LAB_0011df1f;
          }
          *(char **)(topNode + (maxDeviceNames - 1) * 0x20) = deviceName;
          *(char **)(topNode + (maxDeviceNames - 1) * 0x20 + 8) = infoName;
          *(undefined4 *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x10) = hwPrefix._4_4_;
          *(int *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x14) = __pa_unsure_error_id;
          *(int *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x18) = local_170;
        }
      }
      *(undefined8 *)(__s + -8) = 0x11d52b;
      (*alsa_snd_ctl_close)(psVar3);
      pcVar9 = pcStack_e8;
      pPVar1 = (PaUtilAllocationGroup *)scanResults_local[0x24];
      *(undefined8 *)(__s + -8) = 0x11d542;
      PaUtil_GroupFreeMemory(pPVar1,pcVar9);
    }
  }
  if (*alsa_snd_config == (snd_config_ft)0x0) {
    *(undefined8 *)(__s + -8) = 0x11d561;
    i_1._4_4_ = (*(code *)alsa_snd_config_update)();
    if (-1 < i_1._4_4_) goto LAB_0011d5e5;
    *(undefined8 *)(__s + -8) = 0x11d57f;
    pVar12 = pthread_self();
    *(undefined8 *)(__s + -8) = 0x11d591;
    iVar8 = pthread_equal(pVar12,paUnixMainThread);
    iVar7 = i_1._4_4_;
    if (iVar8 != 0) {
      local_220 = (long)i_1._4_4_;
      *(undefined8 *)(__s + -8) = 0x11d5b3;
      pcVar9 = (*alsa_snd_strerror)(iVar7);
      lVar20 = local_220;
      *(undefined8 *)(__s + -8) = 0x11d5c7;
      PaUtil_SetLastHostErrorInfo(paALSA,lVar20,pcVar9);
    }
    *(undefined8 *)(__s + -8) = 0x11d5d5;
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_config_update()\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1394\n"
                     );
    numDeviceNames._4_4_ = -9999;
  }
  else {
LAB_0011d5e5:
    if (*alsa_snd_config == (snd_config_ft)0x0) {
      *(undefined8 *)(__s + -8) = 0x11d613;
      __assert_fail("*alsa_snd_config",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0x575,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *, void **, int *)")
      ;
    }
    psVar15 = *alsa_snd_config;
    *(undefined8 *)(__s + -8) = 0x11d631;
    iVar7 = (*alsa_snd_config_search)(psVar15,"pcm",(snd_config_t **)&pcmInfo);
    psVar5 = pcmInfo;
    if (-1 < iVar7) {
      *(undefined8 *)(__s + -8) = 0x11d64a;
      p_Var13 = (snd_config_iterator_t)(*(code *)alsa_snd_config_iterator_first)(psVar5);
      next = p_Var13;
      *(undefined8 *)(__s + -8) = 0x11d661;
      tpStr = (char *)(*alsa_snd_config_iterator_next)(p_Var13);
      while( true ) {
        psVar5 = pcmInfo;
        local_228 = next;
        *(undefined8 *)(__s + -8) = 0x11d683;
        p_Var14 = (snd_config_iterator_t)(*(code *)alsa_snd_config_iterator_end)(psVar5);
        p_Var13 = next;
        if (local_228 == p_Var14) break;
        idStr = "unknown";
        pcStack_198 = (char *)0x0;
        alsaDeviceName_1._4_4_ = 0;
        n = (snd_config_t *)0x0;
        *(undefined8 *)(__s + -8) = 0x11d6d4;
        psVar15 = (*alsa_snd_config_iterator_entry)(p_Var13);
        ___pa_unsure_error_id_2 = (snd_config_t *)0x0;
        tp = psVar15;
        *(undefined8 *)(__s + -8) = 0x11d704;
        alsaDeviceName_1._4_4_ =
             (*alsa_snd_config_search)(psVar15,"type",(snd_config_t **)&__pa_unsure_error_id_2);
        psVar15 = ___pa_unsure_error_id_2;
        if (alsaDeviceName_1._4_4_ < 0) {
          if ((alsaDeviceName_1._4_4_ != -2) &&
             (__pa_unsure_error_id_3 = alsaDeviceName_1._4_4_, alsaDeviceName_1._4_4_ < 0)) {
            *(undefined8 *)(__s + -8) = 0x11d74a;
            pVar12 = pthread_self();
            *(undefined8 *)(__s + -8) = 0x11d75c;
            iVar8 = pthread_equal(pVar12,paUnixMainThread);
            iVar7 = __pa_unsure_error_id_3;
            if (iVar8 != 0) {
              local_230 = (long)__pa_unsure_error_id_3;
              *(undefined8 *)(__s + -8) = 0x11d77e;
              pcVar9 = (*alsa_snd_strerror)(iVar7);
              lVar20 = local_230;
              *(undefined8 *)(__s + -8) = 0x11d792;
              PaUtil_SetLastHostErrorInfo(paALSA,lVar20,pcVar9);
            }
            *(undefined8 *)(__s + -8) = 0x11d7a0;
            PaUtil_DebugPrint(
                             "Expression \'err\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1415\n"
                             );
            numDeviceNames._4_4_ = -9999;
            goto LAB_0011df1f;
          }
        }
        else {
          *(undefined8 *)(__s + -8) = 0x11d7ce;
          local_1d0 = (*(code *)alsa_snd_config_get_string)(psVar15,&idStr);
          if (local_1d0 < 0) {
            *(undefined8 *)(__s + -8) = 0x11d7ec;
            pVar12 = pthread_self();
            *(undefined8 *)(__s + -8) = 0x11d7fe;
            iVar8 = pthread_equal(pVar12,paUnixMainThread);
            iVar7 = local_1d0;
            if (iVar8 != 0) {
              local_238 = (long)local_1d0;
              *(undefined8 *)(__s + -8) = 0x11d820;
              pcVar9 = (*alsa_snd_strerror)(iVar7);
              lVar20 = local_238;
              *(undefined8 *)(__s + -8) = 0x11d834;
              PaUtil_SetLastHostErrorInfo(paALSA,lVar20,pcVar9);
            }
            *(undefined8 *)(__s + -8) = 0x11d842;
            PaUtil_DebugPrint(
                             "Expression \'alsa_snd_config_get_string( tp, &tpStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1420\n"
                             );
            numDeviceNames._4_4_ = -9999;
            goto LAB_0011df1f;
          }
        }
        psVar15 = tp;
        *(undefined8 *)(__s + -8) = 0x11d86b;
        devInfo._4_4_ = (*(code *)alsa_snd_config_get_id)(psVar15,&stack0xfffffffffffffe68);
        pcVar9 = pcStack_198;
        if (devInfo._4_4_ < 0) {
          *(undefined8 *)(__s + -8) = 0x11d889;
          pVar12 = pthread_self();
          *(undefined8 *)(__s + -8) = 0x11d89b;
          iVar8 = pthread_equal(pVar12,paUnixMainThread);
          iVar7 = devInfo._4_4_;
          if (iVar8 != 0) {
            local_240 = (long)devInfo._4_4_;
            *(undefined8 *)(__s + -8) = 0x11d8bd;
            pcVar9 = (*alsa_snd_strerror)(iVar7);
            lVar20 = local_240;
            *(undefined8 *)(__s + -8) = 0x11d8d1;
            PaUtil_SetLastHostErrorInfo(paALSA,lVar20,pcVar9);
          }
          *(undefined8 *)(__s + -8) = 0x11d8df;
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_config_get_id( n, &idStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1422\n"
                           );
          numDeviceNames._4_4_ = -9999;
          goto LAB_0011df1f;
        }
        *(undefined8 *)(__s + -8) = 0x11d8f9;
        iVar7 = IgnorePlugin(pcVar9);
        pcVar9 = pcStack_198;
        if (iVar7 == 0) {
          local_248 = (PaUtilAllocationGroup *)scanResults_local[0x24];
          *(undefined8 *)(__s + -8) = 0x11d923;
          sVar10 = strlen(pcVar9);
          pPVar1 = local_248;
          *(undefined8 *)(__s + -8) = 0x11d936;
          pcVar16 = (char *)PaUtil_GroupAllocateMemory(pPVar1,sVar10 + 6);
          pcVar9 = pcStack_198;
          deviceName_1 = pcVar16;
          if (pcVar16 == (char *)0x0) {
            *(undefined8 *)(__s + -8) = 0x11d95f;
            PaUtil_DebugPrint(
                             "Expression \'alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 6 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1431\n"
                             );
            numDeviceNames._4_4_ = -0x2708;
            goto LAB_0011df1f;
          }
          *(undefined8 *)(__s + -8) = 0x11d980;
          strcpy(pcVar16,pcVar9);
          pcVar9 = pcStack_198;
          local_250 = (PaUtilAllocationGroup *)scanResults_local[0x24];
          *(undefined8 *)(__s + -8) = 0x11d99e;
          sVar10 = strlen(pcVar9);
          pPVar1 = local_250;
          *(undefined8 *)(__s + -8) = 0x11d9b1;
          pHVar17 = (HwDevInfo *)PaUtil_GroupAllocateMemory(pPVar1,sVar10 + 1);
          pcVar9 = pcStack_198;
          predefined = pHVar17;
          if (pHVar17 == (HwDevInfo *)0x0) {
            *(undefined8 *)(__s + -8) = 0x11d9da;
            PaUtil_DebugPrint(
                             "Expression \'deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1434\n"
                             );
            numDeviceNames._4_4_ = -0x2708;
            goto LAB_0011df1f;
          }
          *(undefined8 *)(__s + -8) = 0x11d9fb;
          strcpy((char *)pHVar17,pcVar9);
          psVar15 = topNode;
          maxDeviceNames = maxDeviceNames + 1;
          if ((topNode == (snd_config_t *)0x0) || (i < maxDeviceNames)) {
            sVar10 = i << 6;
            i = i << 1;
            *(undefined8 *)(__s + -8) = 0x11da34;
            topNode = (snd_config_t *)realloc(psVar15,sVar10);
            if (topNode == (snd_config_t *)0x0) {
              *(undefined8 *)(__s + -8) = 0x11da5a;
              PaUtil_DebugPrint(
                               "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1442\n"
                               );
              numDeviceNames._4_4_ = -0x2708;
              goto LAB_0011df1f;
            }
          }
          pcVar9 = deviceName_1;
          *(undefined8 *)(__s + -8) = 0x11da76;
          n = (snd_config_t *)FindDeviceName(pcVar9);
          *(char **)(topNode + (maxDeviceNames - 1) * 0x20) = deviceName_1;
          *(HwDevInfo **)(topNode + (maxDeviceNames - 1) * 0x20 + 8) = predefined;
          *(undefined4 *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x10) = 1;
          if ((HwDevInfo *)n == (HwDevInfo *)0x0) {
            *(undefined4 *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x14) = 1;
            *(undefined4 *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x18) = 1;
          }
          else {
            *(int *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x14) = ((HwDevInfo *)n)->hasPlayback;
            *(int *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x18) = ((HwDevInfo *)n)->hasCapture;
          }
        }
        pcVar9 = tpStr;
        next = (snd_config_iterator_t)tpStr;
        *(undefined8 *)(__s + -8) = 0x11db72;
        tpStr = (char *)(*alsa_snd_config_iterator_next)((snd_config_iterator_t)pcVar9);
      }
    }
    pPVar1 = (PaUtilAllocationGroup *)scanResults_local[0x24];
    *(undefined8 *)(__s + -8) = 0x11db97;
    __alsa_alloca_size = (size_t)PaUtil_GroupAllocateMemory(pPVar1,0x18);
    *(undefined4 *)(__alsa_alloca_size + 8) = 0xffffffff;
    *(undefined4 *)(__alsa_alloca_size + 0xc) = 0xffffffff;
    pPVar1 = (PaUtilAllocationGroup *)scanResults_local[0x24];
    lVar20 = maxDeviceNames << 3;
    *(undefined8 *)(__s + -8) = 0x11dbd2;
    pvVar18 = PaUtil_GroupAllocateMemory(pPVar1,lVar20);
    *(void **)__alsa_alloca_size = pvVar18;
    if (pvVar18 == (void *)0x0) {
      *(undefined8 *)(__s + -8) = 0x11dbfe;
      PaUtil_DebugPrint(
                       "Expression \'out->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1474\n"
                       );
      numDeviceNames._4_4_ = -0x2708;
    }
    else {
      pPVar1 = (PaUtilAllocationGroup *)scanResults_local[0x24];
      lVar20 = maxDeviceNames * 0x70;
      *(undefined8 *)(__s + -8) = 0x11dc23;
      _devIdx = PaUtil_GroupAllocateMemory(pPVar1,lVar20);
      if (_devIdx != (void *)0x0) {
        cardInfo._0_4_ = 0;
        for (hwDevInfos = (HwDevInfo *)0x0; hwDevInfos < maxDeviceNames;
            hwDevInfos = (HwDevInfo *)((long)&hwDevInfos->alsaName + 1)) {
          hwInfo = (HwDevInfo *)((long)_devIdx + (long)hwDevInfos * 0x70);
          devInfo_1 = (PaAlsaDeviceInfo *)(topNode + (long)hwDevInfos * 0x20);
          pcVar9 = (devInfo_1->baseDeviceInfo).name;
          *(undefined8 *)(__s + -8) = 0x11dcb4;
          iVar7 = strcmp(pcVar9,"dmix");
          if (iVar7 != 0) {
            pcVar9 = (devInfo_1->baseDeviceInfo).name;
            *(undefined8 *)(__s + -8) = 0x11dcd0;
            iVar7 = strcmp(pcVar9,"default");
            ppvVar6 = scanResults_local;
            sVar2 = __alsa_alloca_size;
            pHVar17 = hwInfo;
            deviceHwInfo = devInfo_1;
            if (iVar7 != 0) {
              *(undefined8 *)(__s + -8) = 0x11dcfe;
              paUtilErr_ = FillInDevInfo((PaAlsaHostApiRepresentation *)ppvVar6,
                                         (HwDevInfo *)deviceHwInfo,local_80,
                                         (PaAlsaDeviceInfo *)pHVar17,(int *)&cardInfo,
                                         (PaLinuxScanDeviceInfosResults *)sVar2);
              if (paUtilErr_ < 0) {
                *(undefined8 *)(__s + -8) = 0x11dd25;
                PaUtil_DebugPrint(
                                 "Expression \'FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1498\n"
                                 );
                numDeviceNames._4_4_ = paUtilErr_;
                goto LAB_0011df1f;
              }
            }
          }
        }
        if (maxDeviceNames < (ulong)(long)(int)cardInfo) {
          *(undefined8 *)(__s + -8) = 0x11dd73;
          __assert_fail("devIdx <= numDeviceNames",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                        ,0x5dc,
                        "PaError BuildDeviceList(PaAlsaHostApiRepresentation *, void **, int *)");
        }
        for (hwDevInfos = (HwDevInfo *)0x0; hwDevInfos < maxDeviceNames;
            hwDevInfos = (HwDevInfo *)((long)&hwDevInfos->alsaName + 1)) {
          hwInfo_1 = (HwDevInfo *)((long)_devIdx + (long)hwDevInfos * 0x70);
          hwInfo_2 = (HwDevInfo *)(topNode + (long)hwDevInfos * 0x20);
          pcVar9 = hwInfo_2->name;
          *(undefined8 *)(__s + -8) = 0x11ddc9;
          iVar7 = strcmp(pcVar9,"dmix");
          if (iVar7 == 0) {
LAB_0011ddec:
            ppvVar6 = scanResults_local;
            sVar2 = __alsa_alloca_size;
            devInfo_00 = hwInfo_1;
            pHVar17 = hwInfo_2;
            *(undefined8 *)(__s + -8) = 0x11de13;
            paUtilErr_ = FillInDevInfo((PaAlsaHostApiRepresentation *)ppvVar6,pHVar17,local_80,
                                       (PaAlsaDeviceInfo *)devInfo_00,(int *)&cardInfo,
                                       (PaLinuxScanDeviceInfosResults *)sVar2);
            if (paUtilErr_ < 0) {
              *(undefined8 *)(__s + -8) = 0x11de3a;
              PaUtil_DebugPrint(
                               "Expression \'FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1511\n"
                               );
              numDeviceNames._4_4_ = paUtilErr_;
              goto LAB_0011df1f;
            }
          }
          else {
            pcVar9 = hwInfo_2->name;
            *(undefined8 *)(__s + -8) = 0x11dde5;
            iVar7 = strcmp(pcVar9,"default");
            if (iVar7 == 0) goto LAB_0011ddec;
          }
        }
        for (hwDevInfos = (HwDevInfo *)0x0; psVar15 = topNode, hwDevInfos < maxDeviceNames;
            hwDevInfos = (HwDevInfo *)((long)&hwDevInfos->alsaName + 1)) {
          local_200 = topNode + (long)hwDevInfos * 0x20;
          pPVar1 = (PaUtilAllocationGroup *)scanResults_local[0x24];
          pvVar18 = *(void **)(local_200 + 8);
          *(undefined8 *)(__s + -8) = 0x11dea0;
          PaUtil_GroupFreeMemory(pPVar1,pvVar18);
          pPVar1 = (PaUtilAllocationGroup *)scanResults_local[0x24];
          pvVar18 = *(void **)local_200;
          *(undefined8 *)(__s + -8) = 0x11deba;
          PaUtil_GroupFreeMemory(pPVar1,pvVar18);
        }
        *(undefined8 *)(__s + -8) = 0x11ded1;
        free(psVar15);
        *(int *)(__alsa_alloca_size + 0x10) = (int)cardInfo;
        *(size_t *)count_local = __alsa_alloca_size;
        *(undefined4 *)&(baseApi->privatePaFrontInfo).baseDeviceIndex =
             *(undefined4 *)(__alsa_alloca_size + 0x10);
        goto LAB_0011defc;
      }
      *(undefined8 *)(__s + -8) = 0x11dc49;
      PaUtil_DebugPrint(
                       "Expression \'deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1478\n"
                       );
      numDeviceNames._4_4_ = -0x2708;
    }
  }
LAB_0011df1f:
  iVar7 = (int)cardInfo;
  if (__alsa_alloca_size != 0) {
    pPVar1 = (PaUtilAllocationGroup *)scanResults_local[0x24];
    deviceInfos = *(PaDeviceInfo ***)__alsa_alloca_size;
    *(undefined8 *)(__s + -8) = 0x11df46;
    FreeDeviceInfos(pPVar1,deviceInfos,iVar7);
    *(undefined8 *)__alsa_alloca_size = 0;
  }
LAB_0011defc:
  pvVar18 = _devIdx;
  if (_devIdx != (void *)0x0) {
    pPVar1 = (PaUtilAllocationGroup *)scanResults_local[0x24];
    *(undefined8 *)(__s + -8) = 0x11df17;
    PaUtil_GroupFreeMemory(pPVar1,pvVar18);
  }
  return numDeviceNames._4_4_;
}

Assistant:

static PaError BuildDeviceList( PaAlsaHostApiRepresentation *alsaApi, void** scanResults, int* count)
{
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;
    PaAlsaDeviceInfo *deviceInfoArray;
    int cardIdx = -1, devIdx = 0;
    snd_ctl_card_info_t *cardInfo;
    PaError result = paNoError;
    size_t numDeviceNames = 0, maxDeviceNames = 1, i;
    HwDevInfo *hwDevInfos = NULL;
    snd_config_t *topNode = NULL;
    snd_pcm_info_t *pcmInfo;
    int res;
    int blocking = SND_PCM_NONBLOCK;
    int usePlughw = 0;
    char *hwPrefix = "";
    char alsaCardName[50];
#ifdef PA_ENABLE_DEBUG_OUTPUT
    PaTime startTime = PaUtil_GetTime();
#endif
    PaLinuxScanDeviceInfosResults* out = NULL;

    if( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) && atoi( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) ) )
        blocking = 0;

    /* If PA_ALSA_PLUGHW is 1 (non-zero), use the plughw: pcm throughout instead of hw: */
    if( getenv( "PA_ALSA_PLUGHW" ) && atoi( getenv( "PA_ALSA_PLUGHW" ) ) )
    {
        usePlughw = 1;
        hwPrefix = "plug";
        PA_DEBUG(( "%s: Using Plughw\n", __FUNCTION__ ));
    }

    /* Gather info about hw devices

     * alsa_snd_card_next() modifies the integer passed to it to be:
     *      the index of the first card if the parameter is -1
     *      the index of the next card if the parameter is the index of a card
     *      -1 if there are no more cards
     *
     * The function itself returns 0 if it succeeded. */
    cardIdx = -1;
    alsa_snd_ctl_card_info_alloca( &cardInfo );
    alsa_snd_pcm_info_alloca( &pcmInfo );
    while( alsa_snd_card_next( &cardIdx ) == 0 && cardIdx >= 0 )
    {
        char *cardName;
        int devIdx = -1;
        snd_ctl_t *ctl;
        char buf[67];

        snprintf( alsaCardName, sizeof (alsaCardName), "hw:%d", cardIdx );

        /* Acquire name of card */
        if( alsa_snd_ctl_open( &ctl, alsaCardName, 0 ) < 0 )
        {
            /* Unable to open card :( */
            PA_DEBUG(( "%s: Unable to open device %s\n", __FUNCTION__, alsaCardName ));
            continue;
        }
        alsa_snd_ctl_card_info( ctl, cardInfo );

        PA_ENSURE( PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo )) );

        while( alsa_snd_ctl_pcm_next_device( ctl, &devIdx ) == 0 && devIdx >= 0 )
        {
            char *alsaDeviceName, *deviceName, *infoName;
            size_t len;
            int hasPlayback = 0, hasCapture = 0;

            snprintf( buf, sizeof (buf), "%s%s,%d", hwPrefix, alsaCardName, devIdx );

            /* Obtain info about this particular device */
            alsa_snd_pcm_info_set_device( pcmInfo, devIdx );
            alsa_snd_pcm_info_set_subdevice( pcmInfo, 0 );
            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_CAPTURE );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasCapture = 1;
            }

            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_PLAYBACK );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasPlayback = 1;
            }

            if( !hasPlayback && !hasCapture )
            {
                /* Error */
                continue;
            }

            infoName = SkipCardDetailsInName( (char *)alsa_snd_pcm_info_get_name( pcmInfo ), cardName );

            /* The length of the string written by snprintf plus terminating 0 */
            len = snprintf( NULL, 0, "%s: %s (%s)", cardName, infoName, buf ) + 1;
            PA_UNLESS( deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
                    paInsufficientMemory );
            snprintf( deviceName, len, "%s: %s (%s)", cardName, infoName, buf );

            PA_DEBUG(( "%s: Found device [%d]: %s\n", __FUNCTION__, numDeviceNames, deviceName ));

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            PA_ENSURE( PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf ) );

            hwDevInfos[ numDeviceNames - 1 ].alsaName = alsaDeviceName;
            hwDevInfos[ numDeviceNames - 1 ].name = deviceName;
            hwDevInfos[ numDeviceNames - 1 ].isPlug = usePlughw;
            hwDevInfos[ numDeviceNames - 1 ].hasPlayback = hasPlayback;
            hwDevInfos[ numDeviceNames - 1 ].hasCapture = hasCapture;
        }
        alsa_snd_ctl_close( ctl );
        PaUtil_GroupFreeMemory( alsaApi->allocations, cardName );
    }

    /* Iterate over plugin devices */
    if( NULL == (*alsa_snd_config) )
    {
        /* alsa_snd_config_update is called implicitly by some functions, if this hasn't happened snd_config will be NULL (bleh) */
        ENSURE_( alsa_snd_config_update(), paUnanticipatedHostError );
        PA_DEBUG(( "Updating snd_config\n" ));
    }
    assert( *alsa_snd_config );
    if( ( res = alsa_snd_config_search( *alsa_snd_config, "pcm", &topNode ) ) >= 0 )
    {
        snd_config_iterator_t i, next;

        alsa_snd_config_for_each( i, next, topNode )
        {
            const char *tpStr = "unknown", *idStr = NULL;
            int err = 0;

            char *alsaDeviceName, *deviceName;
            const HwDevInfo *predefined = NULL;
            snd_config_t *n = alsa_snd_config_iterator_entry( i ), * tp = NULL;;

            if( (err = alsa_snd_config_search( n, "type", &tp )) < 0 )
            {
                if( -ENOENT != err )
                {
                    ENSURE_(err, paUnanticipatedHostError);
                }
            }
            else
            {
                ENSURE_( alsa_snd_config_get_string( tp, &tpStr ), paUnanticipatedHostError );
            }
            ENSURE_( alsa_snd_config_get_id( n, &idStr ), paUnanticipatedHostError );
            if( IgnorePlugin( idStr ) )
            {
                PA_DEBUG(( "%s: Ignoring ALSA plugin device [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));
                continue;
            }
            PA_DEBUG(( "%s: Found plugin [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));

            PA_UNLESS( alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 6 ), paInsufficientMemory );
            strcpy( alsaDeviceName, idStr );
            PA_UNLESS( deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 1 ), paInsufficientMemory );
            strcpy( deviceName, idStr );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            predefined = FindDeviceName( alsaDeviceName );

            hwDevInfos[numDeviceNames - 1].alsaName = alsaDeviceName;
            hwDevInfos[numDeviceNames - 1].name     = deviceName;
            hwDevInfos[numDeviceNames - 1].isPlug   = 1;

            if( predefined )
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = predefined->hasPlayback;
                hwDevInfos[numDeviceNames - 1].hasCapture  = predefined->hasCapture;
            }
            else
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = 1;
                hwDevInfos[numDeviceNames - 1].hasCapture  = 1;
            }
        }
    }
    else
        PA_DEBUG(( "%s: Iterating over ALSA plugins failed: %s\n", __FUNCTION__, alsa_snd_strerror( res ) ));

    out = (PaLinuxScanDeviceInfosResults *) PaUtil_GroupAllocateMemory(
                            alsaApi->allocations, sizeof(PaLinuxScanDeviceInfosResults) );

    out->defaultInputDevice = paNoDevice;
    out->defaultOutputDevice = paNoDevice;

    /* allocate deviceInfo memory based on the number of devices */
    PA_UNLESS( out->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) ), paInsufficientMemory );

    /* allocate all device info structs in a contiguous block */
    PA_UNLESS( deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames ), paInsufficientMemory );

    /* Loop over list of cards, filling in info. If a device is deemed unavailable (can't get name),
     * it's ignored.
     *
     * Note that we do this in two stages. This is a workaround owing to the fact that the 'dmix'
     * plugin may cause the underlying hardware device to be busy for a short while even after it
     * (dmix) is closed. The 'default' plugin may also point to the dmix plugin, so the same goes
     * for this.
     */
    PA_DEBUG(( "%s: Filling device info for %d devices\n", __FUNCTION__, numDeviceNames ));
    for( i = 0, devIdx = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( !strcmp( hwInfo->name, "dmix" ) || !strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out ) );
    }
    assert( devIdx <= numDeviceNames );
    /* Now inspect 'dmix' and 'default' plugins */
    for( i = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( strcmp( hwInfo->name, "dmix" ) && strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out ) );
    }

    for( i = 0; i < numDeviceNames; ++i )
    {
        HwDevInfo* hwInfo = &hwDevInfos[i];
        PaUtil_GroupFreeMemory( alsaApi->allocations, hwInfo->name );
        PaUtil_GroupFreeMemory( alsaApi->allocations, hwInfo->alsaName );
    }
    free( hwDevInfos );

    out->deviceCount = devIdx;   /* Number of successfully queried devices */
    *scanResults = out;
    *count = out->deviceCount;

#ifdef PA_ENABLE_DEBUG_OUTPUT
    PA_DEBUG(( "%s: Building device list took %f seconds\n", __FUNCTION__, PaUtil_GetTime() - startTime ));
#endif

end:
    if( deviceInfoArray )
    {
        PaUtil_GroupFreeMemory( alsaApi->allocations, deviceInfoArray );
    }

    return result;

error:
    if( out )
    {
        FreeDeviceInfos( alsaApi->allocations, out->deviceInfos, devIdx );
        out->deviceInfos = NULL;
    }

    goto end;
}